

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceMappingBase.cpp
# Opt level: O2

IDeviceObject * __thiscall
Diligent::ResourceMappingImpl::GetResource(ResourceMappingImpl *this,Char *Name,Uint32 ArrayIndex)

{
  iterator iVar1;
  IDeviceObject *pIVar2;
  string msg;
  
  if ((Name == (Char *)0x0) || (*Name == '\0')) {
    FormatString<char[31]>(&msg,(char (*) [31])"Name must not be null or empty");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/ResourceMappingBase.cpp"
               ,0x56);
    std::__cxx11::string::~string((string *)&msg);
    pIVar2 = (IDeviceObject *)0x0;
  }
  else {
    Threading::SpinLock::lock(&this->m_Lock);
    ResMappingHashKey::ResMappingHashKey((ResMappingHashKey *)&msg,Name,false,ArrayIndex);
    iVar1 = std::
            _Hashtable<Diligent::ResourceMappingImpl::ResMappingHashKey,_std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_Diligent::STDAllocator<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_Diligent::IMemoryAllocator>,_std::__detail::_Select1st,_std::equal_to<Diligent::ResourceMappingImpl::ResMappingHashKey>,_Diligent::HashMapStringKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->m_HashTable)._M_h,(key_type *)&msg);
    HashMapStringKey::Clear((HashMapStringKey *)&msg);
    if (iVar1.
        super__Node_iterator_base<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      pIVar2 = (IDeviceObject *)0x0;
    }
    else {
      pIVar2 = *(IDeviceObject **)
                ((long)iVar1.
                       super__Node_iterator_base<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false>
                       ._M_cur + 0x20);
    }
    Threading::SpinLock::unlock(&this->m_Lock);
  }
  return pIVar2;
}

Assistant:

IDeviceObject* ResourceMappingImpl::GetResource(const Char* Name, Uint32 ArrayIndex)
{
    if (Name == nullptr || *Name == '\0')
    {
        DEV_ERROR("Name must not be null or empty");
        return nullptr;
    }

    Threading::SpinLockGuard Guard{m_Lock};

    // Find an object with the requested name
    auto It = m_HashTable.find(ResMappingHashKey{Name, false, ArrayIndex});
    return It != m_HashTable.end() ? It->second.RawPtr() : nullptr;
}